

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkRenderPassCreateInfo *pass,MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,
               Value *out_value)

{
  uint uVar1;
  VkSubpassDependency *pVVar2;
  VkAttachmentDescription *pVVar3;
  VkAttachmentReference *pVVar4;
  bool bVar5;
  bool bVar6;
  VkSubpassDescription *pVVar7;
  ulong uVar8;
  long lVar9;
  Value preserves;
  Value dep;
  Value inputs;
  Value input;
  Value json_object;
  Value attachments;
  Value subpasses;
  Value deps;
  Data local_1c8;
  Data local_1b8;
  VkSubpassDescription *local_1a0;
  Data local_198;
  Data local_188;
  VkRenderPassCreateInfo *local_170;
  Data local_168;
  Data local_158;
  Data local_148;
  Data local_138;
  Data local_128;
  Data *local_110;
  ulong local_108;
  StringRefType local_100;
  StringRefType local_f0;
  StringRefType local_e0;
  StringRefType local_d0;
  StringRefType local_c0;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  local_158.n.i64 = (Number)0x0;
  local_158.s.str = (Ch *)0x3000000000000;
  local_1b8._4_1_ = '\0';
  local_1b8._5_1_ = '\0';
  local_1b8._6_1_ = '\0';
  local_1b8._7_1_ = '\0';
  local_1b8._0_4_ = pass->flags;
  local_1c8.s.str = (Ch *)0x405000000168467;
  local_1c8.n = (Number)0x5;
  local_1b8.s.str = (Ch *)((ulong)(-1 < (int)pass->flags) << 0x35 | 0x1d6000000000000);
  local_110 = &out_value->data_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_158.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_1c8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_1b8.s,alloc);
  local_128.n = (Number)0x0;
  local_128.s.str = (Ch *)0x4000000000000;
  local_138.n = (Number)0x0;
  local_138.s.str = (Ch *)0x4000000000000;
  local_148.n = (Number)0x0;
  local_148.s.str = (Ch *)0x4000000000000;
  local_170 = pass;
  if (pass->pDependencies != (VkSubpassDependency *)0x0) {
    if (pass->dependencyCount != 0) {
      lVar9 = 0x18;
      pVVar7 = (VkSubpassDescription *)0x0;
      do {
        pVVar2 = local_170->pDependencies;
        local_198.n.i64 = (Number)0x0;
        local_198.s.str = (Ch *)0x3000000000000;
        uVar1 = *(uint *)((long)&pVVar2->srcSubpass + lVar9);
        local_1b8._4_1_ = '\0';
        local_1b8._5_1_ = '\0';
        local_1b8._6_1_ = '\0';
        local_1b8._7_1_ = '\0';
        local_1b8._0_4_ = uVar1;
        local_1c8.s.str = (Ch *)0x40500000016a918;
        local_1c8.n = (Number)0xf;
        local_1b8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        local_1a0 = pVVar7;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_198.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1c8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1b8.s,alloc);
        uVar1 = *(uint *)((long)pVVar2 + lVar9 + -4);
        local_1b8._4_1_ = '\0';
        local_1b8._5_1_ = '\0';
        local_1b8._6_1_ = '\0';
        local_1b8._7_1_ = '\0';
        local_1b8._0_4_ = uVar1;
        local_1c8.s.str = (Ch *)0x405000000168fc9;
        local_1c8.n = (Number)0xd;
        local_1b8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_198.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1c8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1b8.s,alloc);
        uVar1 = *(uint *)((long)pVVar2 + lVar9 + -8);
        local_1b8._4_1_ = '\0';
        local_1b8._5_1_ = '\0';
        local_1b8._6_1_ = '\0';
        local_1b8._7_1_ = '\0';
        local_1b8._0_4_ = uVar1;
        local_1c8.s.str = (Ch *)0x405000000168fae;
        local_1c8.n = (Number)0xd;
        local_1b8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_198.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1c8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1b8.s,alloc);
        uVar1 = *(uint *)((long)pVVar2 + lVar9 + -0xc);
        local_1b8._4_1_ = '\0';
        local_1b8._5_1_ = '\0';
        local_1b8._6_1_ = '\0';
        local_1b8._7_1_ = '\0';
        local_1b8._0_4_ = uVar1;
        local_1c8.s.str = (Ch *)0x405000000168fbc;
        local_1c8.n = (Number)0xc;
        local_1b8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_198.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1c8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1b8.s,alloc);
        uVar1 = *(uint *)((long)pVVar2 + lVar9 + -0x10);
        local_1b8._4_1_ = '\0';
        local_1b8._5_1_ = '\0';
        local_1b8._6_1_ = '\0';
        local_1b8._7_1_ = '\0';
        local_1b8._0_4_ = uVar1;
        local_1c8.s.str = (Ch *)0x405000000168fa1;
        local_1c8.n = (Number)0xc;
        local_1b8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_198.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1c8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1b8.s,alloc);
        uVar1 = *(uint *)((long)pVVar2 + lVar9 + -0x14);
        local_1b8._4_1_ = '\0';
        local_1b8._5_1_ = '\0';
        local_1b8._6_1_ = '\0';
        local_1b8._7_1_ = '\0';
        local_1b8._0_4_ = uVar1;
        local_1c8.s.str = (Ch *)0x40500000016a933;
        local_1c8.n = (Number)0xa;
        local_1b8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_198.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1c8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1b8.s,alloc);
        pass = local_170;
        uVar1 = *(uint *)((long)pVVar2 + lVar9 + -0x18);
        local_1b8._4_1_ = '\0';
        local_1b8._5_1_ = '\0';
        local_1b8._6_1_ = '\0';
        local_1b8._7_1_ = '\0';
        local_1b8._0_4_ = uVar1;
        local_1c8.s.str = (Ch *)0x40500000016a928;
        local_1c8.n.i64 = (Number)0xa;
        local_1b8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_198.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1c8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1b8.s,alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_128.s,
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_198.s,alloc);
        pVVar7 = (VkSubpassDescription *)((long)&local_1a0->flags + 1);
        lVar9 = lVar9 + 0x1c;
      } while (pVVar7 < (VkSubpassDescription *)(ulong)pass->dependencyCount);
    }
    local_1b8.s.str = (Ch *)0x4050000001686fd;
    local_1b8.n = (Number)0xc;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_1b8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_128.s,alloc);
  }
  if (pass->pAttachments != (VkAttachmentDescription *)0x0) {
    if (pass->attachmentCount != 0) {
      lVar9 = 0x20;
      uVar8 = 0;
      do {
        pVVar3 = local_170->pAttachments;
        local_198.n.i64 = (Number)0x0;
        local_198.s.str = (Ch *)0x3000000000000;
        uVar1 = *(uint *)((long)pVVar3 + lVar9 + -0x20);
        local_1b8._4_1_ = '\0';
        local_1b8._5_1_ = '\0';
        local_1b8._6_1_ = '\0';
        local_1b8._7_1_ = '\0';
        local_1b8._0_4_ = uVar1;
        local_1c8.s.str = (Ch *)0x405000000168467;
        local_1c8.n.i64 = (Number)0x5;
        local_1b8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_198.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1c8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1b8.s,alloc);
        local_40.s = "format";
        local_40.length = 6;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkFormat>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_198.s,&local_40,*(VkFormat *)((long)pVVar3 + lVar9 + -0x1c),alloc);
        local_50.s = "finalLayout";
        local_50.length = 0xb;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkImageLayout>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_198.s,&local_50,*(VkImageLayout *)((long)&pVVar3->flags + lVar9),alloc)
        ;
        local_60.s = "initialLayout";
        local_60.length = 0xd;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkImageLayout>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_198.s,&local_60,*(VkImageLayout *)((long)pVVar3 + lVar9 + -4),alloc);
        local_70.s = "loadOp";
        local_70.length = 6;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkAttachmentLoadOp>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_198.s,&local_70,*(VkAttachmentLoadOp *)((long)pVVar3 + lVar9 + -0x14),
                   alloc);
        local_80.s = "storeOp";
        local_80.length = 7;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkAttachmentStoreOp>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_198.s,&local_80,*(VkAttachmentStoreOp *)((long)pVVar3 + lVar9 + -0x10),
                   alloc);
        local_90.s = "samples";
        local_90.length = 7;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkSampleCountFlagBits>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_198.s,&local_90,
                   *(VkSampleCountFlagBits *)((long)pVVar3 + lVar9 + -0x18),alloc);
        local_a0.s = "stencilLoadOp";
        local_a0.length = 0xd;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkAttachmentLoadOp>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_198.s,&local_a0,*(VkAttachmentLoadOp *)((long)pVVar3 + lVar9 + -0xc),
                   alloc);
        pass = local_170;
        local_b0.s = "stencilStoreOp";
        local_b0.length = 0xe;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkAttachmentStoreOp>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_198.s,&local_b0,*(VkAttachmentStoreOp *)((long)pVVar3 + lVar9 + -8),
                   alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_148.s,
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_198.s,alloc);
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + 0x24;
      } while (uVar8 < pass->attachmentCount);
    }
    local_1b8.s.str = (Ch *)0x4050000001686f1;
    local_1b8.n = (Number)0xb;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_1b8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_148.s,alloc);
  }
  if (pass->subpassCount != 0) {
    uVar8 = 0;
    do {
      pVVar7 = pass->pSubpasses + uVar8;
      local_198.n.i64 = (Number)0x0;
      local_198.s.str = (Ch *)0x3000000000000;
      local_1b8._4_1_ = '\0';
      local_1b8._5_1_ = '\0';
      local_1b8._6_1_ = '\0';
      local_1b8._7_1_ = '\0';
      local_1b8._0_4_ = pVVar7->flags;
      local_1c8.s.str = (Ch *)0x405000000168467;
      local_1c8.n.i64 = (Number)0x5;
      local_1b8.s.str = (Ch *)((ulong)(-1 < (int)pVVar7->flags) << 0x35 | 0x1d6000000000000);
      local_108 = uVar8;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_198.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1c8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1b8.s,alloc);
      local_c0.s = "pipelineBindPoint";
      local_c0.length = 0x11;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkPipelineBindPoint>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_198.s,&local_c0,pVVar7->pipelineBindPoint,alloc);
      local_1a0 = pVVar7;
      if (pVVar7->pPreserveAttachments != (uint32_t *)0x0) {
        local_1c8.n.i64 = (Number)0x0;
        local_1c8.s.str = (Ch *)0x4000000000000;
        if (pVVar7->preserveAttachmentCount != 0) {
          uVar8 = 0;
          do {
            pVVar7 = local_1a0;
            local_1b8._4_1_ = '\0';
            local_1b8._5_1_ = '\0';
            local_1b8._6_1_ = '\0';
            local_1b8._7_1_ = '\0';
            local_1b8._0_4_ = local_1a0->pPreserveAttachments[uVar8];
            local_1b8.s.str =
                 (Ch *)((ulong)(-1 < (int)local_1a0->pPreserveAttachments[uVar8]) << 0x35 |
                       0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_1c8.s,
                       (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_1b8.s,alloc);
            uVar8 = uVar8 + 1;
          } while (uVar8 < pVVar7->preserveAttachmentCount);
        }
        local_1b8.s.str = (Ch *)0x4050000001686c0;
        local_1b8.n.i64 = (Number)0x13;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_198.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1b8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1c8.s,alloc);
      }
      if (local_1a0->pInputAttachments != (VkAttachmentReference *)0x0) {
        local_188.n.i64 = (Number)0x0;
        local_188.s.str = (Ch *)0x4000000000000;
        if (local_1a0->inputAttachmentCount != 0) {
          uVar8 = 0;
          do {
            local_168.n.i64 = (Number)0x0;
            local_168.s.str = (Ch *)0x3000000000000;
            pVVar4 = local_1a0->pInputAttachments;
            uVar1 = pVVar4[uVar8].attachment;
            local_1b8._4_1_ = '\0';
            local_1b8._5_1_ = '\0';
            local_1b8._6_1_ = '\0';
            local_1b8._7_1_ = '\0';
            local_1b8._0_4_ = uVar1;
            local_1c8.s.str = (Ch *)0x4050000001690f2;
            local_1c8.n.i64 = (Number)0xa;
            local_1b8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_168.s,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_1c8.s,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_1b8.s,alloc);
            local_d0.s = "layout";
            local_d0.length = 6;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkImageLayout>
                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_168.s,&local_d0,pVVar4[uVar8].layout,alloc);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_188.s,
                       (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_168.s,alloc);
            uVar8 = uVar8 + 1;
          } while (uVar8 < local_1a0->inputAttachmentCount);
        }
        local_1b8.s.str = (Ch *)0x40500000016869e;
        local_1b8.n.i64 = (Number)0x10;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_198.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1b8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_188.s,alloc);
      }
      if (local_1a0->pColorAttachments != (VkAttachmentReference *)0x0) {
        local_188.n.i64 = (Number)0x0;
        local_188.s.str = (Ch *)0x4000000000000;
        if (local_1a0->colorAttachmentCount != 0) {
          uVar8 = 0;
          do {
            local_168.n.i64 = (Number)0x0;
            local_168.s.str = (Ch *)0x3000000000000;
            pVVar4 = local_1a0->pColorAttachments;
            uVar1 = pVVar4[uVar8].attachment;
            local_1b8._4_1_ = '\0';
            local_1b8._5_1_ = '\0';
            local_1b8._6_1_ = '\0';
            local_1b8._7_1_ = '\0';
            local_1b8._0_4_ = uVar1;
            local_1c8.s.str = (Ch *)0x4050000001690f2;
            local_1c8.n.i64 = (Number)0xa;
            local_1b8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_168.s,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_1c8.s,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_1b8.s,alloc);
            local_e0.s = "layout";
            local_e0.length = 6;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkImageLayout>
                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_168.s,&local_e0,pVVar4[uVar8].layout,alloc);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_188.s,
                       (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_168.s,alloc);
            uVar8 = uVar8 + 1;
          } while (uVar8 < local_1a0->colorAttachmentCount);
        }
        local_1b8.s.str = (Ch *)0x4050000001686af;
        local_1b8.n.i64 = (Number)0x10;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_198.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1b8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_188.s,alloc);
      }
      if (local_1a0->pResolveAttachments != (VkAttachmentReference *)0x0) {
        local_188.n.i64 = (Number)0x0;
        local_188.s.str = (Ch *)0x4000000000000;
        if (local_1a0->colorAttachmentCount != 0) {
          uVar8 = 0;
          do {
            local_168.n.i64 = (Number)0x0;
            local_168.s.str = (Ch *)0x3000000000000;
            pVVar4 = local_1a0->pResolveAttachments;
            uVar1 = pVVar4[uVar8].attachment;
            local_1b8._4_1_ = '\0';
            local_1b8._5_1_ = '\0';
            local_1b8._6_1_ = '\0';
            local_1b8._7_1_ = '\0';
            local_1b8._0_4_ = uVar1;
            local_1c8.s.str = (Ch *)0x4050000001690f2;
            local_1c8.n.i64 = (Number)0xa;
            local_1b8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_168.s,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_1c8.s,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_1b8.s,alloc);
            local_f0.s = "layout";
            local_f0.length = 6;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<VkImageLayout>
                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_168.s,&local_f0,pVVar4[uVar8].layout,alloc);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_188.s,
                       (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_168.s,alloc);
            uVar8 = uVar8 + 1;
          } while (uVar8 < local_1a0->colorAttachmentCount);
        }
        local_1b8.s.str = (Ch *)0x40500000016868b;
        local_1b8.n.i64 = (Number)0x12;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_198.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1b8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_188.s,alloc);
      }
      pVVar7 = local_1a0;
      if (local_1a0->pDepthStencilAttachment != (VkAttachmentReference *)0x0) {
        local_188.n.i64 = (Number)0x0;
        local_188.s.str = (Ch *)0x3000000000000;
        uVar1 = local_1a0->pDepthStencilAttachment->attachment;
        local_1b8._4_1_ = '\0';
        local_1b8._5_1_ = '\0';
        local_1b8._6_1_ = '\0';
        local_1b8._7_1_ = '\0';
        local_1b8._0_4_ = uVar1;
        local_1c8.s.str = (Ch *)0x4050000001690f2;
        local_1c8.n.i64 = (Number)0xa;
        local_1b8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_188.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1c8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1b8.s,alloc);
        local_100.s = "layout";
        local_100.length = 6;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkImageLayout>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_188.s,&local_100,pVVar7->pDepthStencilAttachment->layout,alloc);
        local_1b8.s.str = (Ch *)0x405000000168674;
        local_1b8.n.i64 = (Number)0x16;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_198.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_1b8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_188.s,alloc);
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_138.s,
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_198.s,alloc);
      uVar8 = local_108 + 1;
      pass = local_170;
    } while (uVar8 < local_170->subpassCount);
  }
  local_1b8.s.str = (Ch *)0x40500000016870a;
  local_1b8.n = (Number)0x9;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_158.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_1b8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_138.s,alloc);
  bVar5 = true;
  if (pass->pNext != (void *)0x0) {
    local_1c8.n = (Number)0x0;
    local_1c8.s.str = (Ch *)0x0;
    bVar6 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (pass->pNext,alloc,(Value *)&local_1c8.s,(DynamicStateInfo *)0x0);
    if (bVar6) {
      local_1b8.s.str = (Ch *)0x40500000016851d;
      local_1b8.n = (Number)0x5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_158.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1b8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_1c8.s,alloc);
    }
    else {
      bVar5 = false;
    }
  }
  if ((bool)(&local_158 != local_110 & bVar5)) {
    local_110->n = local_158.n;
    (&local_110->n)[1] = (Number)local_158.s.str;
  }
  return bVar5;
}

Assistant:

static bool json_value(const VkRenderPassCreateInfo& pass, Allocator& alloc, Value *out_value)
{
	Value json_object(kObjectType);
	json_object.AddMember("flags", pass.flags, alloc);

	Value deps(kArrayType);
	Value subpasses(kArrayType);
	Value attachments(kArrayType);

	if (pass.pDependencies)
	{
		for (uint32_t i = 0; i < pass.dependencyCount; i++)
		{
			auto &d = pass.pDependencies[i];
			Value dep(kObjectType);
			dep.AddMember("dependencyFlags", d.dependencyFlags, alloc);
			dep.AddMember("dstAccessMask", d.dstAccessMask, alloc);
			dep.AddMember("srcAccessMask", d.srcAccessMask, alloc);
			dep.AddMember("dstStageMask", d.dstStageMask, alloc);
			dep.AddMember("srcStageMask", d.srcStageMask, alloc);
			dep.AddMember("dstSubpass", d.dstSubpass, alloc);
			dep.AddMember("srcSubpass", d.srcSubpass, alloc);
			deps.PushBack(dep, alloc);
		}
		json_object.AddMember("dependencies", deps, alloc);
	}

	if (pass.pAttachments)
	{
		for (uint32_t i = 0; i < pass.attachmentCount; i++)
		{
			auto &a = pass.pAttachments[i];
			Value att(kObjectType);

			att.AddMember("flags", a.flags, alloc);
			att.AddMember("format", a.format, alloc);
			att.AddMember("finalLayout", a.finalLayout, alloc);
			att.AddMember("initialLayout", a.initialLayout, alloc);
			att.AddMember("loadOp", a.loadOp, alloc);
			att.AddMember("storeOp", a.storeOp, alloc);
			att.AddMember("samples", a.samples, alloc);
			att.AddMember("stencilLoadOp", a.stencilLoadOp, alloc);
			att.AddMember("stencilStoreOp", a.stencilStoreOp, alloc);

			attachments.PushBack(att, alloc);
		}
		json_object.AddMember("attachments", attachments, alloc);
	}

	for (uint32_t i = 0; i < pass.subpassCount; i++)
	{
		auto &sub = pass.pSubpasses[i];
		Value p(kObjectType);
		p.AddMember("flags", sub.flags, alloc);
		p.AddMember("pipelineBindPoint", sub.pipelineBindPoint, alloc);

		if (sub.pPreserveAttachments)
		{
			Value preserves(kArrayType);
			for (uint32_t j = 0; j < sub.preserveAttachmentCount; j++)
				preserves.PushBack(sub.pPreserveAttachments[j], alloc);
			p.AddMember("preserveAttachments", preserves, alloc);
		}

		if (sub.pInputAttachments)
		{
			Value inputs(kArrayType);
			for (uint32_t j = 0; j < sub.inputAttachmentCount; j++)
			{
				Value input(kObjectType);
				auto &ia = sub.pInputAttachments[j];
				input.AddMember("attachment", ia.attachment, alloc);
				input.AddMember("layout", ia.layout, alloc);
				inputs.PushBack(input, alloc);
			}
			p.AddMember("inputAttachments", inputs, alloc);
		}

		if (sub.pColorAttachments)
		{
			Value colors(kArrayType);
			for (uint32_t j = 0; j < sub.colorAttachmentCount; j++)
			{
				Value color(kObjectType);
				auto &c = sub.pColorAttachments[j];
				color.AddMember("attachment", c.attachment, alloc);
				color.AddMember("layout", c.layout, alloc);
				colors.PushBack(color, alloc);
			}
			p.AddMember("colorAttachments", colors, alloc);
		}

		if (sub.pResolveAttachments)
		{
			Value resolves(kArrayType);
			for (uint32_t j = 0; j < sub.colorAttachmentCount; j++)
			{
				Value resolve(kObjectType);
				auto &r = sub.pResolveAttachments[j];
				resolve.AddMember("attachment", r.attachment, alloc);
				resolve.AddMember("layout", r.layout, alloc);
				resolves.PushBack(resolve, alloc);
			}
			p.AddMember("resolveAttachments", resolves, alloc);
		}

		if (sub.pDepthStencilAttachment)
		{
			Value depth_stencil(kObjectType);
			depth_stencil.AddMember("attachment", sub.pDepthStencilAttachment->attachment, alloc);
			depth_stencil.AddMember("layout", sub.pDepthStencilAttachment->layout, alloc);
			p.AddMember("depthStencilAttachment", depth_stencil, alloc);
		}

		subpasses.PushBack(p, alloc);
	}
	json_object.AddMember("subpasses", subpasses, alloc);

	if (!pnext_chain_add_json_value(json_object, pass, alloc, nullptr))
		return false;

	*out_value = json_object;
	return true;
}